

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region.c
# Opt level: O1

boolean inside_region(region *reg,int x,int y)

{
  nhrect *pnVar1;
  long lVar2;
  
  if (((((reg != (region *)0x0) && ((reg->bounding_box).lx <= x)) && (x <= (reg->bounding_box).hx))
      && (((reg->bounding_box).ly <= y && (y <= (reg->bounding_box).hy)))) &&
     (0 < (long)reg->nrects)) {
    pnVar1 = reg->rects;
    lVar2 = 0;
    while (((x < pnVar1[lVar2].lx || (pnVar1[lVar2].hx < x)) ||
           ((y < pnVar1[lVar2].ly || (pnVar1[lVar2].hy < y))))) {
      lVar2 = lVar2 + 1;
      if (reg->nrects == lVar2) {
        return '\0';
      }
    }
    return '\x01';
  }
  return '\0';
}

Assistant:

static boolean inside_region(struct region *reg, int x, int y)
{
    int i;

    if (reg == NULL || !inside_rect(&(reg->bounding_box), x, y))
	return FALSE;
    for (i = 0; i < reg->nrects; i++)
	if (inside_rect(&(reg->rects[i]), x, y))
	    return TRUE;
    return FALSE;
}